

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O3

int64_t __thiscall TPZGeoMesh::NodeIndex(TPZGeoMesh *this,TPZGeoNode *nod)

{
  TPZGeoNode *pTVar1;
  long nelem;
  long lVar2;
  
  lVar2 = (this->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  if (lVar2 < 1) {
    lVar2 = 0;
  }
  else {
    nelem = 0;
    do {
      pTVar1 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(this->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
      if (pTVar1 == nod) {
        return nelem;
      }
      nelem = nelem + 1;
    } while (lVar2 != nelem);
  }
  return lVar2;
}

Assistant:

void TPZGeoMesh::GetBoundaryElements(int64_t NodFrom, int64_t NodTo,TPZStack<TPZGeoEl *> &ElementVec,TPZStack<int> &Sides)
{
	//Find a first element whose first node on the side is NodFrom
	//TPZGeoEl *def = 0;
	//TPZAVLMap<int,TPZGeoEl *> elmap(def);
	map<int64_t,TPZGeoEl *> elmap;
	int64_t i,nelements=NElements();
	for(i=0;i<nelements;i++)
	{
		TPZGeoEl *el = fElementVec[i];
		if(el) elmap[el->Id()]=fElementVec[i];
	}
	
	int64_t currentnode = NodFrom;
	TPZGeoEl *candidate = 0;
	int candidateside = 0;
	while(currentnode != NodTo)
	{
		// put all elements connected to currentnode in elmap, eliminate the elements
		//	from elmap which do not contain the node
		BuildElementsAroundNode(currentnode,elmap);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			std::map<int64_t, TPZGeoEl *>::iterator it;
			sout << "Elements around node " << currentnode << " : ";
			for(it=elmap.begin(); it!=elmap.end(); it++)
			{
				sout << it->second->Index() << "|";
				int in;
				for(in=0; in<it->second->NNodes(); in++)
				{
					sout << it->second->NodeIndex(in) << ":";
				}
				sout << " -- ";
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
#endif
		
		// find, within elmap the element which has currentnode as its first boundary side
		// node
		FindElement(elmap, currentnode, candidate, candidateside);
		//	if the element found is already contained in the list, we have a circular list
		// if no element was found, the topology may not be two dimensional
		if(!candidate)
		{
			LOGPZ_WARN(logger,"GetBoundaryElements no adjacent element found");
			break;
		}
		int64_t index = 0;
		int64_t nelvec = ElementVec.NElements();
		while(index<nelvec && ElementVec[index] != candidate) index++;
		if(index <nelvec && Sides[index]==candidateside) break;
		ElementVec.Push(candidate);
		Sides.Push(candidateside);
		elmap.erase(elmap.begin(), elmap.end());//CleanUp();
		elmap[candidate->Id()] = candidate;
		// initialize the list in which to look for connected elements
		currentnode = candidate->SideNodeIndex(candidateside,1);
	}
}